

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O0

void __thiscall FileInputSource::seek(FileInputSource *this,qpdf_offset_t offset,int whence)

{
  int iVar1;
  string local_158;
  string local_138;
  allocator<char> local_101;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  qpdf_offset_t qStack_18;
  int whence_local;
  qpdf_offset_t offset_local;
  FileInputSource *this_local;
  
  local_1c = whence;
  qStack_18 = offset;
  offset_local = (qpdf_offset_t)this;
  iVar1 = QUtil::seek(this->file,offset,whence);
  if (iVar1 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"seek to ",&local_101);
    std::operator+(&local_e0,&local_100,&this->filename);
    std::operator+(&local_c0,&local_e0,", offset ");
    std::__cxx11::to_string(&local_138,qStack_18);
    std::operator+(&local_a0,&local_c0,&local_138);
    std::operator+(&local_80,&local_a0," (");
    std::__cxx11::to_string(&local_158,local_1c);
    std::operator+(&local_60,&local_80,&local_158);
    std::operator+(&local_40,&local_60,")");
    QUtil::throw_system_error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
  }
  return;
}

Assistant:

void
FileInputSource::seek(qpdf_offset_t offset, int whence)
{
    if (QUtil::seek(this->file, offset, whence) == -1) {
        QUtil::throw_system_error(
            std::string("seek to ") + this->filename + ", offset " + std::to_string(offset) + " (" +
            std::to_string(whence) + ")");
    }
}